

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::scriptDisplayName
          (LocaleDisplayNamesImpl *this,char *script,UnicodeString *result,UBool skipAdjust)

{
  UBool UVar1;
  UnicodeString *local_48;
  UnicodeString *local_40;
  UBool skipAdjust_local;
  UnicodeString *result_local;
  char *script_local;
  LocaleDisplayNamesImpl *this_local;
  
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::get(&this->langData,"Scripts%short",script,result);
    UVar1 = UnicodeString::isBogus(result);
    if (UVar1 == '\0') {
      local_40 = result;
      if (skipAdjust == '\0') {
        local_40 = adjustForUsageAndContext(this,kCapContextUsageScript,result);
      }
      return local_40;
    }
  }
  ICUDataTable::get(&this->langData,"Scripts",script,result);
  local_48 = result;
  if (skipAdjust == '\0') {
    local_48 = adjustForUsageAndContext(this,kCapContextUsageScript,result);
  }
  return local_48;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::scriptDisplayName(const char* script,
                                          UnicodeString& result,
                                          UBool skipAdjust) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Scripts%short", script, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageScript, result);
        }
    }
    langData.get("Scripts", script, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageScript, result);
}